

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btSingleRayCallback::btSingleRayCallback
          (btSingleRayCallback *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          btCollisionWorld *world,RayResultCallback *resultCallback)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btMatrix3x3 *pbVar4;
  btVector3 *pbVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  (this->super_btBroadphaseRayCallback).super_btBroadphaseAabbCallback.
  _vptr_btBroadphaseAabbCallback = (_func_int **)&PTR__btBroadphaseAabbCallback_00223bb8;
  uVar1 = *(undefined8 *)rayFromWorld->m_floats;
  uVar2 = *(undefined8 *)(rayFromWorld->m_floats + 2);
  *(undefined8 *)(this->m_rayFromWorld).m_floats = uVar1;
  *(undefined8 *)((this->m_rayFromWorld).m_floats + 2) = uVar2;
  uVar3 = *(undefined8 *)(rayToWorld->m_floats + 2);
  *(undefined8 *)(this->m_rayToWorld).m_floats = *(undefined8 *)rayToWorld->m_floats;
  *(undefined8 *)((this->m_rayToWorld).m_floats + 2) = uVar3;
  this->m_world = world;
  this->m_resultCallback = resultCallback;
  (this->m_rayFromTrans).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar4 = &(this->m_rayFromTrans).m_basis;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_rayFromTrans).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_rayFromTrans).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar5 = (this->m_rayFromTrans).m_basis.m_el;
  pbVar5[1].m_floats[2] = 0.0;
  pbVar5[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_rayFromTrans).m_basis;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  (this->m_rayFromTrans).m_basis.m_el[2].m_floats[2] = 1.0;
  *(undefined8 *)((this->m_rayFromTrans).m_origin.m_floats + 3) = 0x3f80000000000000;
  *(undefined8 *)((this->m_rayFromTrans).m_basis.m_el[2].m_floats + 3) = 0;
  (this->m_rayFromTrans).m_origin.m_floats[1] = 0.0;
  (this->m_rayFromTrans).m_origin.m_floats[2] = 0.0;
  *(undefined8 *)(this->m_rayFromTrans).m_origin.m_floats = uVar1;
  *(undefined8 *)((this->m_rayFromTrans).m_origin.m_floats + 2) = uVar2;
  pbVar4 = &(this->m_rayToTrans).m_basis;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_rayToTrans).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_rayToTrans).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar5 = (this->m_rayToTrans).m_basis.m_el;
  pbVar5[1].m_floats[2] = 0.0;
  pbVar5[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_rayToTrans).m_basis;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  (this->m_rayToTrans).m_basis.m_el[2].m_floats[2] = 1.0;
  *(undefined8 *)((this->m_rayToTrans).m_basis.m_el[2].m_floats + 3) = 0;
  (this->m_rayToTrans).m_origin.m_floats[1] = 0.0;
  (this->m_rayToTrans).m_origin.m_floats[2] = 0.0;
  (this->m_rayToTrans).m_origin.m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)((this->m_rayToWorld).m_floats + 2);
  *(undefined8 *)(this->m_rayToTrans).m_origin.m_floats =
       *(undefined8 *)(this->m_rayToWorld).m_floats;
  *(undefined8 *)((this->m_rayToTrans).m_origin.m_floats + 2) = uVar1;
  fVar10 = rayToWorld->m_floats[2] - rayFromWorld->m_floats[2];
  fVar11 = (float)*(undefined8 *)rayToWorld->m_floats - (float)*(undefined8 *)rayFromWorld->m_floats
  ;
  fVar12 = (float)((ulong)*(undefined8 *)rayToWorld->m_floats >> 0x20) -
           (float)((ulong)*(undefined8 *)rayFromWorld->m_floats >> 0x20);
  fVar6 = fVar10 * fVar10 + fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar6 = 1.0 / fVar6;
  fVar10 = fVar10 * fVar6;
  fVar11 = fVar11 * fVar6;
  fVar12 = fVar12 * fVar6;
  auVar8._4_4_ = fVar12;
  auVar8._0_4_ = fVar11;
  auVar8._8_4_ = fVar6 * 0.0;
  auVar8._12_4_ = fVar6 * 0.0;
  auVar8 = divps(_DAT_001f53f0,auVar8);
  fVar6 = (float)(-(uint)(fVar11 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar11 == 0.0) & auVar8._0_4_);
  fVar7 = (float)(-(uint)(fVar12 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar12 == 0.0) & auVar8._4_4_);
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[0] = fVar6;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[1] = fVar7;
  fVar9 = (float)(-(uint)(fVar10 == 0.0) & 0x5d5e0b6b |
                 ~-(uint)(fVar10 == 0.0) & (uint)(1.0 / fVar10));
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[2] = fVar9;
  *(ulong *)(this->super_btBroadphaseRayCallback).m_signs =
       CONCAT44(-(uint)(fVar7 < 0.0),-(uint)(fVar6 < 0.0)) & 0x100000001;
  (this->super_btBroadphaseRayCallback).m_signs[2] = (uint)(fVar9 < 0.0);
  (this->super_btBroadphaseRayCallback).m_lambda_max =
       ((this->m_rayToWorld).m_floats[2] - (this->m_rayFromWorld).m_floats[2]) * fVar10 +
       ((this->m_rayToWorld).m_floats[0] - (this->m_rayFromWorld).m_floats[0]) * fVar11 +
       fVar12 * ((this->m_rayToWorld).m_floats[1] - (this->m_rayFromWorld).m_floats[1]);
  return;
}

Assistant:

btSingleRayCallback(const btVector3& rayFromWorld,const btVector3& rayToWorld,const btCollisionWorld* world,btCollisionWorld::RayResultCallback& resultCallback)
		:m_rayFromWorld(rayFromWorld),
		m_rayToWorld(rayToWorld),
		m_world(world),
		m_resultCallback(resultCallback)
	{
		m_rayFromTrans.setIdentity();
		m_rayFromTrans.setOrigin(m_rayFromWorld);
		m_rayToTrans.setIdentity();
		m_rayToTrans.setOrigin(m_rayToWorld);

		btVector3 rayDir = (rayToWorld-rayFromWorld);

		rayDir.normalize ();
		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(m_rayToWorld-m_rayFromWorld);

	}